

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnTableSize(SharedValidator *this,Location *loc,Var *table_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Var VStack_68;
  
  RVar1 = CheckInstr(this,(Opcode)0xd4,loc);
  Var::Var(&VStack_68,table_var);
  RVar2 = CheckTableIndex(this,&VStack_68,(TableType *)0x0);
  Var::~Var(&VStack_68);
  RVar3 = TypeChecker::OnTableSize(&this->typechecker_);
  RVar1.enum_._0_1_ = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnTableSize(const Location& loc, Var table_var) {
  Result result = CheckInstr(Opcode::TableSize, loc);
  result |= CheckTableIndex(table_var);
  result |= typechecker_.OnTableSize();
  return result;
}